

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-dependency.h
# Opt level: O3

void __thiscall dynamicgraph::TimeDependency<int>::~TimeDependency(TimeDependency<int> *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  this->_vptr_TimeDependency = (_func_int **)&PTR__TimeDependency_00127be8;
  p_Var2 = (this->dependencies).
           super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->dependencies) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~TimeDependency() {}